

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nuklear.h
# Opt level: O1

void * nk_buffer_alloc(nk_buffer *b,nk_buffer_allocation_type type,nk_size size,nk_size align)

{
  ulong uVar1;
  nk_allocation_type nVar2;
  nk_plugin_alloc p_Var3;
  bool bVar4;
  nk_size nVar5;
  uint uVar6;
  void *pvVar7;
  ulong uVar8;
  ulong uVar9;
  void *pvVar10;
  long lVar11;
  float fVar12;
  
  if (b == (nk_buffer *)0x0) {
    __assert_fail("b",
                  "/workspace/llm4binary/github/license_all_cmakelists_1510/wjakob[P]glfw/deps/nuklear.h"
                  ,0x1fcc,
                  "void *nk_buffer_alloc(struct nk_buffer *, enum nk_buffer_allocation_type, nk_size, nk_size)"
                 );
  }
  if (size == 0) {
    __assert_fail("size",
                  "/workspace/llm4binary/github/license_all_cmakelists_1510/wjakob[P]glfw/deps/nuklear.h"
                  ,0x1fcd,
                  "void *nk_buffer_alloc(struct nk_buffer *, enum nk_buffer_allocation_type, nk_size, nk_size)"
                 );
  }
  b->needed = b->needed + size;
  if (type == NK_BUFFER_FRONT) {
    nVar5 = b->allocated;
  }
  else {
    nVar5 = b->size - size;
  }
  pvVar10 = (void *)((long)(b->memory).ptr + nVar5);
  if (type == NK_BUFFER_BACK) {
    if (align == 0) {
LAB_00107532:
      lVar11 = 0;
      pvVar7 = pvVar10;
    }
    else {
      pvVar7 = (void *)(-align & (ulong)pvVar10);
      lVar11 = (long)pvVar10 - (long)pvVar7;
    }
  }
  else {
    if (align == 0) goto LAB_00107532;
    pvVar7 = (void *)(-align & (long)pvVar10 + (align - 1));
    lVar11 = (long)pvVar7 - (long)pvVar10;
  }
  uVar1 = lVar11 + size;
  if (type == NK_BUFFER_FRONT) {
    bVar4 = b->size < uVar1 + b->allocated;
  }
  else {
    uVar8 = 0;
    if (uVar1 <= b->size) {
      uVar8 = b->size - uVar1;
    }
    bVar4 = uVar8 <= b->allocated;
  }
  if (!bVar4) goto LAB_001076ca;
  nVar2 = b->type;
  if (nVar2 == NK_BUFFER_DYNAMIC) {
    p_Var3 = (b->pool).alloc;
    if ((p_Var3 == (nk_plugin_alloc)0x0) || ((b->pool).free == (nk_plugin_free)0x0)) {
      __assert_fail("b->pool.alloc && b->pool.free",
                    "/workspace/llm4binary/github/license_all_cmakelists_1510/wjakob[P]glfw/deps/nuklear.h"
                    ,0x1fe0,
                    "void *nk_buffer_alloc(struct nk_buffer *, enum nk_buffer_allocation_type, nk_size, nk_size)"
                   );
    }
    uVar1 = (b->memory).size;
    fVar12 = (float)uVar1 * b->grow_factor;
    uVar8 = (ulong)fVar12;
    uVar8 = (long)(fVar12 - 9.223372e+18) & (long)uVar8 >> 0x3f | uVar8;
    uVar6 = ((int)b->allocated + (int)size) - 1;
    uVar6 = uVar6 >> 1 | uVar6;
    uVar6 = uVar6 >> 2 | uVar6;
    uVar6 = uVar6 >> 4 | uVar6;
    uVar6 = uVar6 >> 8 | uVar6;
    uVar9 = (ulong)((uVar6 >> 0x10 | uVar6) + 1);
    if (uVar8 <= uVar9) {
      uVar8 = uVar9;
    }
    pvVar10 = (*p_Var3)((b->pool).userdata,(b->memory).ptr,uVar8);
    if (pvVar10 == (void *)0x0) {
      __assert_fail("temp",
                    "/workspace/llm4binary/github/license_all_cmakelists_1510/wjakob[P]glfw/deps/nuklear.h"
                    ,0x1faa,"void *nk_buffer_realloc(struct nk_buffer *, nk_size, nk_size *)");
    }
    (b->memory).size = uVar8;
    pvVar7 = (b->memory).ptr;
    if (pvVar10 != pvVar7) {
      nk_memcopy(pvVar10,pvVar7,uVar1);
      (*(b->pool).free)((b->pool).userdata,(b->memory).ptr);
    }
    nVar5 = uVar1 - b->size;
    if (nVar5 != 0) {
      uVar8 = uVar8 - nVar5;
      nk_memcopy((void *)((long)pvVar10 + uVar8),(void *)(b->size + (long)pvVar10),nVar5);
    }
    b->size = uVar8;
    (b->memory).ptr = pvVar10;
    if (type == NK_BUFFER_FRONT) {
      nVar5 = b->allocated;
    }
    else {
      nVar5 = b->size - size;
    }
    pvVar10 = (void *)((long)pvVar10 + nVar5);
    if (type == NK_BUFFER_BACK) {
      if (align == 0) {
LAB_001076c3:
        lVar11 = 0;
        pvVar7 = pvVar10;
      }
      else {
        pvVar7 = (void *)(-align & (ulong)pvVar10);
        lVar11 = (long)pvVar10 - (long)pvVar7;
      }
    }
    else {
      if (align == 0) goto LAB_001076c3;
      pvVar7 = (void *)(-align & (long)pvVar10 + (align - 1));
      lVar11 = (long)pvVar7 - (long)pvVar10;
    }
  }
  if (nVar2 != NK_BUFFER_DYNAMIC) {
    return (void *)0x0;
  }
LAB_001076ca:
  if (type == NK_BUFFER_FRONT) {
    b->allocated = b->allocated + size + lVar11;
  }
  else {
    b->size = b->size - (size + lVar11);
  }
  b->needed = b->needed + lVar11;
  b->calls = b->calls + 1;
  return pvVar7;
}

Assistant:

NK_LIB void*
nk_buffer_alloc(struct nk_buffer *b, enum nk_buffer_allocation_type type,
    nk_size size, nk_size align)
{
    int full;
    nk_size alignment;
    void *unaligned;
    void *memory;

    NK_ASSERT(b);
    NK_ASSERT(size);
    if (!b || !size) return 0;
    b->needed += size;

    /* calculate total size with needed alignment + size */
    if (type == NK_BUFFER_FRONT)
        unaligned = nk_ptr_add(void, b->memory.ptr, b->allocated);
    else unaligned = nk_ptr_add(void, b->memory.ptr, b->size - size);
    memory = nk_buffer_align(unaligned, align, &alignment, type);

    /* check if buffer has enough memory*/
    if (type == NK_BUFFER_FRONT)
        full = ((b->allocated + size + alignment) > b->size);
    else full = ((b->size - NK_MIN(b->size,(size + alignment))) <= b->allocated);

    if (full) {
        nk_size capacity;
        if (b->type != NK_BUFFER_DYNAMIC)
            return 0;
        NK_ASSERT(b->pool.alloc && b->pool.free);
        if (b->type != NK_BUFFER_DYNAMIC || !b->pool.alloc || !b->pool.free)
            return 0;

        /* buffer is full so allocate bigger buffer if dynamic */
        capacity = (nk_size)((float)b->memory.size * b->grow_factor);
        capacity = NK_MAX(capacity, nk_round_up_pow2((nk_uint)(b->allocated + size)));
        b->memory.ptr = nk_buffer_realloc(b, capacity, &b->memory.size);
        if (!b->memory.ptr) return 0;

        /* align newly allocated pointer */
        if (type == NK_BUFFER_FRONT)
            unaligned = nk_ptr_add(void, b->memory.ptr, b->allocated);
        else unaligned = nk_ptr_add(void, b->memory.ptr, b->size - size);
        memory = nk_buffer_align(unaligned, align, &alignment, type);
    }
    if (type == NK_BUFFER_FRONT)
        b->allocated += size + alignment;
    else b->size -= (size + alignment);
    b->needed += alignment;
    b->calls++;
    return memory;
}